

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

void __thiscall
ExpressionContext::PushLoopScope(ExpressionContext *this,bool allowBreak,bool allowContinue)

{
  uint uniqueId;
  ScopeData *this_00;
  ScopeData *local_20;
  ScopeData *next;
  bool allowContinue_local;
  ExpressionContext *pEStack_10;
  bool allowBreak_local;
  ExpressionContext *this_local;
  
  next._6_1_ = allowContinue;
  next._7_1_ = allowBreak;
  pEStack_10 = this;
  this_00 = get<ScopeData>(this);
  uniqueId = this->uniqueScopeId;
  this->uniqueScopeId = uniqueId + 1;
  ScopeData::ScopeData(this_00,this->allocator,this->scope,uniqueId,SCOPE_LOOP);
  local_20 = this_00;
  if (this->scope != (ScopeData *)0x0) {
    SmallArray<ScopeData_*,_2U>::push_back(&this->scope->scopes,&local_20);
    local_20->startOffset = this->scope->dataSize;
  }
  if ((next._7_1_ & 1) != 0) {
    local_20->breakDepth = local_20->breakDepth + 1;
  }
  if ((next._6_1_ & 1) != 0) {
    local_20->contiueDepth = local_20->contiueDepth + 1;
  }
  this->scope = local_20;
  if (this->lookupLocation != (SynBase *)0x0) {
    this->scope->unrestricted = true;
  }
  return;
}

Assistant:

void ExpressionContext::PushLoopScope(bool allowBreak, bool allowContinue)
{
	ScopeData *next = new (get<ScopeData>()) ScopeData(allocator, scope, uniqueScopeId++, SCOPE_LOOP);

	if(scope)
	{
		scope->scopes.push_back(next);

		next->startOffset = scope->dataSize;
	}

	if(allowBreak)
		next->breakDepth++;

	if(allowContinue)
		next->contiueDepth++;

	scope = next;

	if(lookupLocation)
		scope->unrestricted = true;
}